

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,executor_type *executor)

{
  basic_executor_type<std::allocator<void>,_0UL> *in_RSI;
  long in_RDI;
  basic_executor_type<std::allocator<void>,_0UL> *in_stack_00000008;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffe8;
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)this_00,in_RSI);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(in_stack_00000010,in_stack_00000008);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)&stack0xffffffffffffffe8);
  std::fstream::fstream((void *)(in_RDI + 0x30));
  std::__cxx11::string::string(this_00);
  *(undefined1 *)(in_RDI + 0x260) = 0;
  return;
}

Assistant:

basic_seq_coro_file(asio::io_context::executor_type executor)
      : executor_wrapper_(executor) {}